

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number.cpp
# Opt level: O0

Variable __thiscall LiteScript::_Type_NUMBER::OPostDecrement(_Type_NUMBER *this,Variable *obj)

{
  Object *pOVar1;
  Number *pNVar2;
  Variable *in_RDX;
  uint *extraout_RDX;
  Variable VVar3;
  Number local_2c;
  undefined1 local_21;
  Variable *local_20;
  Variable *obj_local;
  _Type_NUMBER *this_local;
  Variable *res;
  
  local_21 = 0;
  local_20 = in_RDX;
  obj_local = obj;
  this_local = this;
  pOVar1 = Variable::operator->(in_RDX);
  Memory::Create((Memory *)this,(Type *)pOVar1->memory);
  pOVar1 = Variable::operator->(local_20);
  pNVar2 = Object::GetData<LiteScript::Number>(pOVar1);
  Number::operator--(&local_2c,(int)pNVar2);
  pOVar1 = Variable::operator->((Variable *)this);
  pNVar2 = Object::GetData<LiteScript::Number>(pOVar1);
  Number::operator=(pNVar2,&local_2c);
  VVar3.nb_ref = extraout_RDX;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::_Type_NUMBER::OPostDecrement(LiteScript::Variable& obj) const {
    Variable res = obj->memory.Create(Type::NUMBER);
    res->GetData<Number>() = obj->GetData<Number>()--;
    return res;
}